

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

int __thiscall
fmt::v8::
basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>,_char16_t>_>
::get_id<char16_t>(basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>,_char16_t>_>
                   *this,basic_string_view<char16_t> name)

{
  char_type_conflict *__s;
  bool bVar1;
  size_t sVar2;
  value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>,_char16_t>_>
  *local_78;
  basic_string_view<char16_t> local_58;
  ulong local_48;
  size_t i;
  named_arg_value<char16_t> *named_args;
  basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>,_char16_t>_>
  *this_local;
  basic_string_view<char16_t> name_local;
  
  bVar1 = has_named_args(this);
  if (bVar1) {
    bVar1 = is_packed(this);
    if (bVar1) {
      local_78 = (this->field_1).values_ + -1;
    }
    else {
      local_78 = (this->field_1).values_ + -2;
    }
    for (local_48 = 0; local_48 < (local_78->field_0).string.size; local_48 = local_48 + 1) {
      __s = *(char_type_conflict **)((long)(local_78->field_0).pointer + local_48 * 0x10);
      local_58.data_ = __s;
      sVar2 = std::char_traits<char16_t>::length(__s);
      local_58.size_ = sVar2;
      bVar1 = v8::operator==(local_58,name);
      if (bVar1) {
        return *(int *)((long)(local_78->field_0).pointer + local_48 * 0x10 + 8);
      }
    }
  }
  return -1;
}

Assistant:

auto get_id(basic_string_view<Char> name) const -> int {
    if (!has_named_args()) return -1;
    const auto& named_args =
        (is_packed() ? values_[-1] : args_[-1].value_).named_args;
    for (size_t i = 0; i < named_args.size; ++i) {
      if (named_args.data[i].name == name) return named_args.data[i].id;
    }
    return -1;
  }